

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int get_intersection(string *s1,string *s2)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  pointer pcVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  pointer pcVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  
  uVar3 = s1->_M_string_length;
  iVar10 = 0;
  lVar6 = std::__cxx11::string::find((char *)s2,(ulong)(s1->_M_dataplus)._M_p,0);
  iVar9 = (int)uVar3;
  if ((lVar6 == -1) && (iVar9 = 0, uVar3 != 0)) {
    pcVar4 = (s1->_M_dataplus)._M_p;
    pcVar5 = (s2->_M_dataplus)._M_p;
    uVar7 = 0;
    pcVar8 = pcVar4;
    do {
      bVar11 = true;
      if (pcVar4[uVar7] == *pcVar5) {
        lVar6 = 1;
        do {
          bVar11 = uVar7 + lVar6 < uVar3;
          if (!bVar11) {
            iVar10 = (int)uVar3 - (int)uVar7;
            break;
          }
          pcVar1 = pcVar8 + lVar6;
          pcVar2 = pcVar5 + lVar6;
          lVar6 = lVar6 + 1;
        } while (*pcVar1 == *pcVar2);
      }
      if (!bVar11) {
        return iVar10;
      }
      uVar7 = uVar7 + 1;
      pcVar8 = pcVar8 + 1;
    } while (uVar7 != uVar3);
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int get_intersection(const std::string& s1, const std::string& s2)
{
    size_t l = s1.length();
    if (std::string::npos != s2.find(s1))
    {
        return l;
    }
    for (size_t i = 0; i < l; i++)
    {
        bool result = true;
        for (size_t j = i; j < l; j++)
        {
            if (s1[j] != s2[j - i])
            {
                result = false;
                break;
            }
        }
        if (result)
        {
            return l - i;
        }
    }
    return 0;
}